

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_psbt.cpp
# Opt level: O2

void __thiscall Psbt_SetTxInOnly_Test::TestBody(Psbt_SetTxInOnly_Test *this)

{
  _func_int *message;
  char *pcVar1;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_1;
  TxInReference txin_r;
  Psbt psbt;
  TxIn txin_l;
  TxIn txin_w;
  
  cfd::core::Psbt::Psbt(&psbt);
  txin_l.super_AbstractTxIn._vptr_AbstractTxIn._0_4_ = 0;
  txin_r.super_AbstractTxInReference._vptr_AbstractTxInReference._0_4_ =
       cfd::core::Psbt::GetTxInCount(&psbt);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&txin_w,"0","psbt.GetTxInCount()",(int *)&txin_l,(uint *)&txin_r);
  if ((char)txin_w.super_AbstractTxIn._vptr_AbstractTxIn == '\0') {
    testing::Message::Message((Message *)&txin_l);
    if (txin_w.super_AbstractTxIn.txid_._vptr_Txid == (_func_int **)0x0) {
      message = (_func_int *)0x4d37ee;
    }
    else {
      message = *txin_w.super_AbstractTxIn.txid_._vptr_Txid;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&txin_r,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x195,(char *)message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&txin_r,(Message *)&txin_l);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&txin_r);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&txin_l);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&txin_w.super_AbstractTxIn.txid_);
  std::__cxx11::string::string
            ((string *)&txin_r,"c078957064d70a5e80c3c23302528524d424aaabce86fb3fc1b6e6ea76fd7f26",
             (allocator *)&gtest_ar_1);
  cfd::core::Txid::Txid((Txid *)&txin_l,(string *)&txin_r);
  cfd::core::TxIn::TxIn(&txin_w,(Txid *)&txin_l,1,0xffffffff);
  cfd::core::Txid::~Txid((Txid *)&txin_l);
  std::__cxx11::string::~string((string *)&txin_r);
  std::__cxx11::string::string
            ((string *)&gtest_ar_1,
             "c0ecc9313d16355d71b96acff5bca43cdb593289e50154bab12cff422a46257d",
             (allocator *)&gtest_ar_3);
  cfd::core::Txid::Txid((Txid *)&txin_r,(string *)&gtest_ar_1);
  cfd::core::TxIn::TxIn(&txin_l,(Txid *)&txin_r,0,0xffffffff);
  cfd::core::Txid::~Txid((Txid *)&txin_r);
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  cfd::core::TxInReference::TxInReference(&txin_r,&txin_l);
  cfd::core::Psbt::AddTxIn(&psbt,&txin_w);
  cfd::core::Psbt::AddTxIn(&psbt,&txin_r);
  gtest_ar_3.success_ = true;
  gtest_ar_3._1_3_ = 0;
  gtest_ar_2._0_4_ = cfd::core::Psbt::GetTxInCount(&psbt);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&gtest_ar_1,"2","psbt.GetTxInCount()",(int *)&gtest_ar_3,
             (uint *)&gtest_ar_2);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_3);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x19b,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_3);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  cfd::core::Psbt::GetData((ByteData *)&gtest_ar_3,&psbt);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar_1,(ByteData *)&gtest_ar_3);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,
             "\"70736274ff01005c0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0000000000000000\""
             ,"psbt.GetData().GetHex().c_str()",
             "70736274ff01005c0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0000000000000000"
             ,(char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_));
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_3);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x19d,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  cfd::core::Psbt::GetBase64_abi_cxx11_((string *)&gtest_ar_1,&psbt);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_3,
             "\"cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAAAAA==\""
             ,"psbt.GetBase64().c_str()",
             "cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAAAAA=="
             ,(char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_));
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x19e,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  cfd::core::AbstractTxInReference::~AbstractTxInReference(&txin_r.super_AbstractTxInReference);
  cfd::core::AbstractTxIn::~AbstractTxIn(&txin_l.super_AbstractTxIn);
  cfd::core::AbstractTxIn::~AbstractTxIn(&txin_w.super_AbstractTxIn);
  cfd::core::Psbt::~Psbt(&psbt);
  return;
}

Assistant:

TEST(Psbt, SetTxInOnly) {
  Psbt psbt;
  EXPECT_EQ(0, psbt.GetTxInCount());
  TxIn txin_w(Txid("c078957064d70a5e80c3c23302528524d424aaabce86fb3fc1b6e6ea76fd7f26"), 1, 0xffffffff);
  TxIn txin_l(Txid("c0ecc9313d16355d71b96acff5bca43cdb593289e50154bab12cff422a46257d"), 0, 0xffffffff);
  TxInReference txin_r(txin_l);
  psbt.AddTxIn(txin_w);
  psbt.AddTxIn(txin_r);
  EXPECT_EQ(2, psbt.GetTxInCount());

  EXPECT_STREQ("70736274ff01005c0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0000000000000000", psbt.GetData().GetHex().c_str());
  EXPECT_STREQ("cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAAAAA==", psbt.GetBase64().c_str());
}